

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O0

void __thiscall csv::internals::IBasicCSVParser::reset_data_ptr(IBasicCSVParser *this)

{
  element_type *peVar1;
  shared_ptr<csv::internals::RawCSVData> local_20;
  IBasicCSVParser *local_10;
  IBasicCSVParser *this_local;
  
  local_10 = this;
  std::make_shared<csv::internals::RawCSVData>();
  std::shared_ptr<csv::internals::RawCSVData>::operator=(&this->data_ptr,&local_20);
  std::shared_ptr<csv::internals::RawCSVData>::~shared_ptr(&local_20);
  peVar1 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data_ptr);
  memcpy(&peVar1->parse_flags,&this->_parse_flags,0x400);
  peVar1 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data_ptr);
  std::shared_ptr<csv::internals::ColNames>::operator=(&peVar1->col_names,&this->_col_names);
  peVar1 = std::
           __shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data_ptr);
  this->fields = &peVar1->fields;
  return;
}

Assistant:

CSV_INLINE void IBasicCSVParser::reset_data_ptr() {
            this->data_ptr = std::make_shared<RawCSVData>();
            this->data_ptr->parse_flags = this->_parse_flags;
            this->data_ptr->col_names = this->_col_names;
            this->fields = &(this->data_ptr->fields);
        }